

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O3

MOJOSHADER_error * errorlist_flatten(ErrorList *list)

{
  ErrorItem *pEVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  MOJOSHADER_error *pMVar5;
  ErrorItem *pEVar6;
  MOJOSHADER_error *pMVar7;
  int iVar8;
  
  if (list->count != 0) {
    pMVar5 = (MOJOSHADER_error *)(*list->m)(list->count * 0x18,list->d);
    iVar8 = 0;
    if (pMVar5 != (MOJOSHADER_error *)0x0) {
      pEVar6 = (list->head).next;
      if (pEVar6 != (ErrorItem *)0x0) {
        iVar8 = 0;
        pMVar7 = pMVar5;
        do {
          pEVar1 = pEVar6->next;
          uVar2 = *(undefined4 *)&(pEVar6->error).field_0x14;
          pMVar7->error_position = (pEVar6->error).error_position;
          *(undefined4 *)&pMVar7->field_0x14 = uVar2;
          uVar2 = *(undefined4 *)((long)&(pEVar6->error).error + 4);
          uVar3 = *(undefined4 *)&(pEVar6->error).filename;
          uVar4 = *(undefined4 *)((long)&(pEVar6->error).filename + 4);
          *(undefined4 *)&pMVar7->error = *(undefined4 *)&(pEVar6->error).error;
          *(undefined4 *)((long)&pMVar7->error + 4) = uVar2;
          *(undefined4 *)&pMVar7->filename = uVar3;
          *(undefined4 *)((long)&pMVar7->filename + 4) = uVar4;
          (*list->f)(pEVar6,list->d);
          pMVar7 = pMVar7 + 1;
          iVar8 = iVar8 + 1;
          pEVar6 = pEVar1;
        } while (pEVar1 != (ErrorItem *)0x0);
      }
      if (iVar8 == list->count) {
        list->count = 0;
        (list->head).next = (ErrorItem *)0x0;
        list->tail = &list->head;
        return pMVar5;
      }
      __assert_fail("total == list->count",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_common.c"
                    ,0x281,"MOJOSHADER_error *errorlist_flatten(ErrorList *)");
    }
  }
  return (MOJOSHADER_error *)0x0;
}

Assistant:

MOJOSHADER_error *errorlist_flatten(ErrorList *list)
{
    if (list->count == 0)
        return NULL;

    int total = 0;
    MOJOSHADER_error *retval = (MOJOSHADER_error *)
            list->m(sizeof (MOJOSHADER_error) * list->count, list->d);
    if (retval == NULL)
        return NULL;

    ErrorItem *item = list->head.next;
    while (item != NULL)
    {
        ErrorItem *next = item->next;
        // reuse the string allocations
        memcpy(&retval[total], &item->error, sizeof (MOJOSHADER_error));
        list->f(item, list->d);
        item = next;
        total++;
    } // while

    assert(total == list->count);
    list->count = 0;
    list->head.next = NULL;
    list->tail = &list->head;
    return retval;
}